

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

User * __thiscall Database::getUserById(User *__return_storage_ptr__,Database *this,int id)

{
  int iVar1;
  ostream *poVar2;
  DatabaseException *pDVar3;
  char *errorMsg;
  string error;
  string local_a0;
  string query;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  errorMsg = (char *)0x0;
  User::User(__return_storage_ptr__);
  std::__cxx11::to_string(&local_a0,id);
  std::operator+(&error,"select * from users where id = ",&local_a0);
  std::operator+(&query,&error,";");
  std::__cxx11::string::~string((string *)&error);
  std::__cxx11::string::~string((string *)&local_a0);
  iVar1 = sqlite3_exec(this->database,query._M_dataplus._M_p,make_user_callback,
                       __return_storage_ptr__,&errorMsg);
  if (iVar1 != 0) {
    std::__cxx11::string::string((string *)&error,errorMsg,(allocator *)&local_a0);
    sqlite3_free(errorMsg);
    pDVar3 = (DatabaseException *)__cxa_allocate_exception(0x28);
    std::operator+(&local_40,"Error while getting user by id: ",&error);
    DatabaseException::DatabaseException(pDVar3,&local_40);
    __cxa_throw(pDVar3,&DatabaseException::typeinfo,DatabaseException::~DatabaseException);
  }
  if (__return_storage_ptr__->id != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"User got successfully");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&query);
    return __return_storage_ptr__;
  }
  pDVar3 = (DatabaseException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_60,"User not found",(allocator *)&error);
  DatabaseException::DatabaseException(pDVar3,&local_60);
  __cxa_throw(pDVar3,&DatabaseException::typeinfo,DatabaseException::~DatabaseException);
}

Assistant:

User Database::getUserById(int id)
{
	char* errorMsg = nullptr;
	User result;
	std::string query = "select * from users where id = " + std::to_string(id) + ";";

	int failure = sqlite3_exec(database, query.c_str(), make_user_callback, &result, &errorMsg);

	if(failure)
	{
		std::string error(errorMsg);
		sqlite3_free(errorMsg);
		throw DatabaseException("Error while getting user by id: " + error);
	}
	else if(result.isEmpty())
	{
		throw DatabaseException("User not found");
	}
	else
	{
		std::cout << "User got successfully" << std::endl;
		return result;
	}
}